

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

string * __thiscall
CLI::detail::generate_set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *set)

{
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  size_type local_38;
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  *(undefined2 *)&__return_storage_ptr__->field_2 = 0x7b;
  __return_storage_ptr__->_M_string_length = 1;
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,",","");
  join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,CLI::detail::generate_set<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::__cxx11::string_const&)_1_,void>
            (&local_40,this,local_60);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(char *)local_40,local_38);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'}');
  return __return_storage_ptr__;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}